

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

SingleOperationStatistics * __thiscall
deqp::gles3::Performance::(anonymous_namespace)::
calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>>
          (SingleOperationStatistics *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
          *samples,offset_in_SampleType_to_deUint64 target)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  uint uVar4;
  ulong *puVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  allocator_type local_31;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_30,*(long *)(this + 8) - *(long *)this >> 6,&local_31);
  puVar3 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6);
  if (0 < (int)uVar4) {
    puVar5 = (ulong *)((long)&(samples->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDurationWithUnrelatedUploadSize>_>_>
                              )._M_impl.super__Vector_impl_data._M_end_of_storage + *(long *)this);
    uVar6 = 0;
    do {
      local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = *puVar5;
      uVar6 = uVar6 + 1;
      puVar5 = puVar5 + 8;
    } while ((uVar4 & 0x7fffffff) != uVar6);
  }
  if (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    lVar1 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar2,puVar3);
  }
  __return_storage_ptr__->minTime =
       (float)*local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
  __return_storage_ptr__->maxTime =
       (float)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
  fVar8 = (float)(((long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
  fVar7 = floorf(fVar8 * 0.5);
  fVar9 = fVar8 * 0.5 - (float)(int)fVar7;
  __return_storage_ptr__->medianTime =
       (float)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(int)fVar7 + 1] * fVar9 +
       (float)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(int)fVar7] * (1.0 - fVar9);
  fVar7 = floorf(fVar8 * 0.1);
  fVar9 = fVar8 * 0.1 - (float)(int)fVar7;
  __return_storage_ptr__->min2DecileTime =
       (float)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(int)fVar7 + 1] * fVar9 +
       (float)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(int)fVar7] * (1.0 - fVar9);
  fVar7 = floorf(fVar8 * 0.9);
  fVar8 = fVar8 * 0.9 - (float)(int)fVar7;
  __return_storage_ptr__->max9DecileTime =
       (float)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(int)fVar7 + 1] * fVar8 +
       (float)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(int)fVar7] * (1.0 - fVar8);
  operator_delete(local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_30.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

SingleOperationStatistics calculateSingleOperationStatistics (const std::vector<T>& samples, deUint64 T::SampleType::*target)
{
	SingleOperationStatistics	stats;
	std::vector<deUint64>		values(samples.size());

	for (int ndx = 0; ndx < (int)samples.size(); ++ndx)
		values[ndx] = samples[ndx].duration.*target;

	std::sort(values.begin(), values.end());

	stats.minTime			= (float)values.front();
	stats.maxTime			= (float)values.back();
	stats.medianTime		= linearSample(values, 0.5f);
	stats.min2DecileTime	= linearSample(values, 0.1f);
	stats.max9DecileTime	= linearSample(values, 0.9f);

	return stats;
}